

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_extraction.hpp
# Opt level: O3

Image4u * eos::render::extract_texture
                    (Image4u *__return_storage_ptr__,Mesh *mesh,Matrix4f *view_model_matrix,
                    Matrix4f *projection_matrix,ProjectionType projection_type,Image4u *image,
                    int texturemap_resolution)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined4 uVar1;
  DenseStorage<float,_2,_2,_1,_0> DVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  pointer paVar5;
  pointer pMVar6;
  pointer paVar7;
  pointer pMVar8;
  pointer __dest;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Image4u *pIVar17;
  int iVar18;
  pointer paVar19;
  pointer paVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  size_t __n;
  ulong uVar24;
  int iVar25;
  Matrix<float,_3,_1,_0,_3,_1> *vtx;
  pointer pMVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  anon_class_16_2_aecbacc2 __f;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  wnd_coords;
  Texture image_to_extract_from_as_tex;
  Vector4f clip_coords;
  Rasterizer<eos::render::ExtractionFragmentShader> extraction_rasterizer;
  void *local_238;
  iterator iStack_230;
  Matrix<float,_4,_1,_0,_4,_1> *local_228;
  Image4u *local_218;
  vector<bool,_std::allocator<bool>_> local_210;
  undefined1 local_1e8 [16];
  pointer local_1d8;
  double dStack_1d0;
  double local_1a8;
  double dStack_1a0;
  optional<eos::render::Texture> local_190;
  Texture local_168;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  double local_128;
  double dStack_120;
  double local_f8;
  double dStack_f0;
  Rasterizer<eos::render::ExtractionFragmentShader> local_e8;
  Vertex<double> local_88;
  
  paVar20 = (mesh->tti).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start;
  paVar5 = (mesh->tti).
           super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar20 == paVar5 &&
      ((long)(mesh->vertices).
             super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(mesh->vertices).
             super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 -
      ((long)(mesh->texcoords).
             super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(mesh->texcoords).
             super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) != 0) {
    __assert_fail("mesh.vertices.size() == mesh.texcoords.size() || !mesh.tti.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/texture_extraction.hpp"
                  ,0x4d,
                  "eos::core::Image4u eos::render::extract_texture(const core::Mesh &, Eigen::Matrix4f, Eigen::Matrix4f, ProjectionType, const eos::core::Image4u &, int)"
                 );
  }
  if ((paVar20 != paVar5) &&
     ((long)paVar5 - (long)paVar20 !=
      (long)(mesh->tvi).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)(mesh->tvi).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start)) {
    __assert_fail("mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/texture_extraction.hpp"
                  ,0x4f,
                  "eos::core::Image4u eos::render::extract_texture(const core::Mesh &, Eigen::Matrix4f, Eigen::Matrix4f, ProjectionType, const eos::core::Image4u &, int)"
                 );
  }
  local_e8.enable_depth_test = true;
  local_e8.perspective_correct_barycentric_weights = true;
  local_e8.enable_far_clipping = true;
  local_e8.viewport_width = texturemap_resolution;
  local_e8.viewport_height = texturemap_resolution;
  local_e8.colorbuffer.height_ = 0;
  local_e8.colorbuffer.width_ = 0;
  local_e8.colorbuffer.row_stride = 0;
  local_e8.depthbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.depthbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.depthbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.colorbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.colorbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.colorbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.depthbuffer.height_ = 0;
  local_e8.depthbuffer.width_ = 0;
  local_e8.depthbuffer.row_stride = 0;
  Rasterizer<eos::render::ExtractionFragmentShader>::clear_buffers(&local_e8);
  create_mipmapped_texture(&local_168,image,1);
  local_e8.enable_depth_test = false;
  local_e8.perspective_correct_barycentric_weights = false;
  local_1e8._0_8_ = (LhsNested)0x0;
  local_1e8._8_8_ = (RhsNested)0x0;
  local_1d8 = (pointer)0x0;
  __f.modelview = view_model_matrix;
  __f.viewspace_vertices =
       (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        *)local_1e8;
  std::
  for_each<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,3,1,0,3,1>const*,std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>>,eos::render::compute_per_vertex_self_occlusion(std::vector<Eigen::Matrix<float,3,1,0,3,1>,std::allocator<Eigen::Matrix<float,3,1,0,3,1>>>const&,std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>const&,Eigen::Matrix<float,4,4,0,4,4>const&,eos::render::detail::RayDirection)::_lambda(auto:1_const&)_1_>
            ((mesh->vertices).
             super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (mesh->vertices).
             super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,__f);
  compute_per_vertex_self_occlusion
            (&local_210,
             (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)local_1e8,&mesh->tvi,(uint)(projection_type != Orthographic));
  local_218 = __return_storage_ptr__;
  if ((LhsNested)local_1e8._0_8_ != (LhsNested)0x0) {
    operator_delete((void *)local_1e8._0_8_,(long)local_1d8 - local_1e8._0_8_);
  }
  local_238 = (void *)0x0;
  iStack_230._M_current = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
  local_228 = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
  pMVar26 = (mesh->vertices).
            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar6 = (mesh->vertices).
           super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar26 != pMVar6) {
    do {
      local_1e8._0_8_ = projection_matrix;
      local_1e8._8_8_ = view_model_matrix;
      local_1d8 = pMVar26;
      Eigen::internal::
      homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>>
      ::evalTo<Eigen::Matrix<float,4,1,0,4,1>>
                ((homogeneous_left_product_impl<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                  *)local_1e8,(Matrix<float,_4,_1,_0,_4,_1> *)local_138);
      local_1e8._12_4_ = local_138._12_4_;
      auVar33._4_4_ = local_138._12_4_;
      auVar33._0_4_ = local_138._12_4_;
      auVar33._8_4_ = local_138._12_4_;
      auVar33._12_4_ = local_138._12_4_;
      auVar33 = divps(local_138,auVar33);
      auVar28._0_12_ = auVar33._0_12_;
      auVar28._12_4_ = 1.0 / (float)local_138._12_4_;
      local_138._0_8_ =
           CONCAT44((float)image->height_ - (float)image->height_ * 0.5 * (auVar33._4_4_ + 1.0),
                    (float)image->width_ * 0.5 * (auVar33._0_4_ + 1.0));
      local_138._8_8_ = auVar28._8_8_;
      local_1e8._0_8_ = (LhsNested)local_138;
      if (iStack_230._M_current == local_228) {
        std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>::
        _M_realloc_insert<Eigen::Matrix<float,4,1,0,4,1>const&>
                  ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                    *)&local_238,iStack_230,(Matrix<float,_4,_1,_0,_4,_1> *)local_138);
      }
      else {
        *(undefined8 *)
         ((iStack_230._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
         m_storage.m_data.array = local_138._0_8_;
        *(undefined8 *)
         (((iStack_230._M_current)->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
          m_storage.m_data.array + 2) = local_138._8_8_;
        iStack_230._M_current = iStack_230._M_current + 1;
      }
      pMVar26 = pMVar26 + 1;
    } while (pMVar26 != pMVar6);
  }
  paVar20 = (mesh->tvi).
            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((mesh->tvi).super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != paVar20) {
    paVar5 = (mesh->tti).
             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_148._0_4_ = (undefined4)texturemap_resolution;
    paVar7 = (mesh->tti).
             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_148._4_4_ = local_148._0_4_;
    local_148._8_4_ = local_148._0_4_;
    local_148._12_4_ = local_148._0_4_;
    lVar27 = 8;
    uVar23 = 0;
    do {
      paVar19 = paVar20;
      if (paVar5 != paVar7) {
        paVar19 = (mesh->tti).
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      iVar18 = *(int *)((long)paVar20->_M_elems + lVar27 + -8);
      uVar22 = (ulong)iVar18;
      iVar25 = iVar18 + 0x3f;
      if (-1 < (long)uVar22) {
        iVar25 = iVar18;
      }
      if ((local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [(long)(iVar25 >> 6) + ((ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           >> (uVar22 & 0x3f) & 1) != 0) {
        iVar18 = *(int *)((long)paVar20->_M_elems + lVar27 + -4);
        uVar24 = (ulong)iVar18;
        iVar25 = iVar18 + 0x3f;
        if (-1 < (long)uVar24) {
          iVar25 = iVar18;
        }
        if ((local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [(long)(iVar25 >> 6) +
              ((ulong)((uVar24 & 0x800000000000003f) < 0x8000000000000001) - 1)] >> (uVar24 & 0x3f)
            & 1) != 0) {
          iVar18 = *(int *)((long)paVar20->_M_elems + lVar27);
          uVar21 = (ulong)iVar18;
          iVar25 = iVar18 + 0x3f;
          if (-1 < (long)uVar21) {
            iVar25 = iVar18;
          }
          if ((local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p
               [(long)(iVar25 >> 6) +
                ((ulong)((uVar21 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar21 & 0x3f) & 1) != 0) {
            pMVar8 = (mesh->texcoords).
                     super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            DVar2.m_data.array =
                 pMVar8[*(int *)((long)paVar19->_M_elems + lVar27 + -8)].
                 super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data;
            local_1e8._0_8_ = (undefined8)(DVar2.m_data.array[0] * (float)local_148._0_4_);
            local_1e8._8_8_ = (undefined8)(DVar2.m_data.array[1] * (float)local_148._4_4_);
            uVar3 = *(undefined8 *)((long)local_238 + uVar22 * 0x10 + 8);
            local_1d8 = (pointer)(double)(float)uVar3;
            dStack_1d0 = (double)(float)((ulong)uVar3 >> 0x20);
            auVar29._8_8_ = 0;
            auVar29._0_8_ = *(ulong *)((long)local_238 + uVar22 * 0x10);
            uVar1 = image->height_;
            uVar4 = image->width_;
            fVar31 = (float)(int)uVar1;
            fVar32 = (float)(int)uVar4;
            auVar13._4_4_ = fVar31;
            auVar13._0_4_ = fVar32;
            auVar13._8_8_ = 0;
            auVar33 = divps(auVar29,auVar13);
            fVar9 = auVar33._0_4_;
            local_1a8 = (double)fVar9;
            fVar11 = auVar33._4_4_;
            dStack_1a0 = (double)fVar11;
            DVar2.m_data.array =
                 pMVar8[*(int *)((long)paVar19->_M_elems + lVar27 + -4)].
                 super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data;
            local_138._8_8_ = (double)(DVar2.m_data.array[1] * (float)local_148._4_4_);
            local_138._0_8_ = (double)(DVar2.m_data.array[0] * (float)local_148._0_4_);
            uVar3 = *(undefined8 *)((long)local_238 + uVar24 * 0x10 + 8);
            local_128 = (double)(float)uVar3;
            dStack_120 = (double)(float)((ulong)uVar3 >> 0x20);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = *(ulong *)((long)local_238 + uVar24 * 0x10);
            auVar14._4_4_ = fVar31;
            auVar14._0_4_ = fVar32;
            auVar14._8_8_ = 0;
            auVar33 = divps(auVar35,auVar14);
            fVar10 = auVar33._0_4_;
            local_f8 = (double)fVar10;
            fVar12 = auVar33._4_4_;
            dStack_f0 = (double)fVar12;
            iVar18 = *(int *)((long)paVar19->_M_elems + lVar27);
            DVar2.m_data.array =
                 pMVar8[iVar18].super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                 m_storage.m_data;
            local_88.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[0] = (double)(DVar2.m_data.array[0] * (float)local_148._0_4_);
            local_88.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[1] = (double)(DVar2.m_data.array[1] * (float)local_148._4_4_);
            uVar3 = *(undefined8 *)((long)local_238 + uVar21 * 0x10 + 8);
            local_88.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[2] = (double)(float)uVar3;
            local_88.position.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[3] = (double)(float)((ulong)uVar3 >> 0x20);
            auVar34._8_8_ = 0;
            auVar34._0_8_ = *(ulong *)((long)local_238 + uVar21 * 0x10);
            auVar15._4_4_ = fVar31;
            auVar15._0_4_ = fVar32;
            auVar15._8_8_ = 0;
            auVar33 = divps(auVar34,auVar15);
            fVar31 = auVar33._0_4_;
            fVar32 = auVar33._4_4_;
            local_88.texcoords.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
            m_storage.m_data.array[1]._0_4_ = SUB84((double)fVar32,0);
            local_88.texcoords.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
            m_storage.m_data.array[0] = (double)fVar31;
            local_88.texcoords.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
            m_storage.m_data.array[1]._4_4_ = (int)((ulong)(double)fVar32 >> 0x20);
            auVar30._4_4_ = -(uint)(fVar11 < 0.0);
            auVar30._0_4_ = -(uint)(fVar9 < 0.0);
            auVar30._8_4_ = -(uint)(fVar10 < 0.0);
            auVar30._12_4_ = -(uint)(fVar12 < 0.0);
            auVar16._4_4_ = -(uint)(1.0 < fVar11);
            auVar16._0_4_ = -(uint)(1.0 < fVar9);
            auVar16._8_4_ = -(uint)(1.0 < fVar10);
            auVar16._12_4_ = -(uint)(1.0 < fVar12);
            iVar18 = movmskps(iVar18,auVar30 | auVar16);
            if ((((iVar18 == 0) && (fVar31 <= 1.0)) && (fVar32 <= 1.0)) &&
               ((0.0 <= fVar31 && (0.0 <= fVar32)))) {
              std::
              vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
              ::vector((vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                        *)&local_190,&local_168.mipmaps);
              local_190.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
              super__Optional_payload<eos::render::Texture,_true,_false,_false>.
              super__Optional_payload_base<eos::render::Texture>._M_payload._M_value.widthLog =
                   local_168.widthLog;
              local_190.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
              super__Optional_payload<eos::render::Texture,_true,_false,_false>.
              super__Optional_payload_base<eos::render::Texture>._M_payload._M_value.heightLog =
                   local_168.heightLog;
              local_190.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
              super__Optional_payload<eos::render::Texture,_true,_false,_false>.
              super__Optional_payload_base<eos::render::Texture>._M_payload._26_2_ =
                   local_168._26_2_;
              local_190.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
              super__Optional_payload<eos::render::Texture,_true,_false,_false>.
              super__Optional_payload_base<eos::render::Texture>._M_payload._M_value.mipmaps_num =
                   local_168.mipmaps_num;
              local_190.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
              super__Optional_payload<eos::render::Texture,_true,_false,_false>.
              super__Optional_payload_base<eos::render::Texture>._M_engaged = true;
              Rasterizer<eos::render::ExtractionFragmentShader>::raster_triangle<double>
                        (&local_e8,(Vertex<double> *)local_1e8,(Vertex<double> *)local_138,&local_88
                         ,&local_190);
              if (local_190.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
                  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
                  super__Optional_payload_base<eos::render::Texture>._M_engaged == true) {
                local_190.super__Optional_base<eos::render::Texture,_false,_false>._M_payload.
                super__Optional_payload<eos::render::Texture,_true,_false,_false>.
                super__Optional_payload_base<eos::render::Texture>._M_engaged = false;
                std::
                vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                ::~vector((vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                           *)&local_190);
              }
            }
          }
        }
      }
      uVar23 = uVar23 + 1;
      paVar20 = (mesh->tvi).
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar27 = lVar27 + 0xc;
    } while (uVar23 < (ulong)(((long)(mesh->tvi).
                                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar20 >> 2
                              ) * -0x5555555555555555));
  }
  pIVar17 = local_218;
  local_218->row_stride = local_e8.colorbuffer.row_stride;
  local_218->height_ = local_e8.colorbuffer.height_;
  local_218->width_ = local_e8.colorbuffer.width_;
  this = &local_218->data_;
  (local_218->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_218->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_218->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            (&this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
             (long)local_e8.colorbuffer.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_e8.colorbuffer.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  __dest = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)local_e8.colorbuffer.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_e8.colorbuffer.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (__n != 0) {
    memmove(__dest,local_e8.colorbuffer.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,__n);
  }
  (pIVar17->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __dest + __n;
  if (local_238 != (void *)0x0) {
    operator_delete(local_238,(long)local_228 - (long)local_238);
  }
  if (local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_210.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  std::
  vector<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
  ::~vector(&local_168.mipmaps);
  if (local_e8.depthbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.depthbuffer.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.depthbuffer.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.depthbuffer.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.colorbuffer.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.colorbuffer.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.colorbuffer.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.colorbuffer.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pIVar17;
}

Assistant:

inline eos::core::Image4u extract_texture(const core::Mesh& mesh, Eigen::Matrix4f view_model_matrix,
                                          Eigen::Matrix4f projection_matrix, ProjectionType projection_type,
                                          const eos::core::Image4u& image, int texturemap_resolution = 512)
{
    // Assert that either there are texture coordinates given for each vertex (in which case the texture map
    // doesn't contain any seams), or that a separate list of texture triangle indices is given (i.e. mesh.tti
    // is not empty):
    assert(mesh.vertices.size() == mesh.texcoords.size() || !mesh.tti.empty());
    // Sanity check on the texture triangle indices: They should be either empty or equal to tvi.size():
    assert(mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size());

    using detail::divide_by_w;
    using detail::RayDirection;
    using Eigen::Vector2f;
    using Eigen::Vector2d;
    using Eigen::Vector3f;
    using Eigen::Vector3d;
    using Eigen::Vector4f;
    using Eigen::Vector4d;
    using std::vector;
    // We only need a rasteriser to remap the texture, not the complete SoftwareRenderer:
    Rasterizer<ExtractionFragmentShader> extraction_rasterizer(texturemap_resolution, texturemap_resolution);
    Texture image_to_extract_from_as_tex = create_mipmapped_texture(image, 1);
    extraction_rasterizer.enable_depth_test = false; // We don't need to depth-test in the rendered image (which is the texture map).
    extraction_rasterizer.perspective_correct_barycentric_weights = false; // We want the uncorrected lambda be passed to our shader

    // For the per-vertex view angle, and the self-occlusion tests, we have to know the projection type, and
    // then use different vector directions depending on the projection type:
    RayDirection ray_direction_type;
    if (projection_type == ProjectionType::Orthographic)
    {
        ray_direction_type = RayDirection::Parallel;
    } else
    {
        ray_direction_type = RayDirection::TowardsOrigin;
    }

    // Test for self-occlusion, i.e. whether each vertex is visible from
    // the camera origin:
    const vector<bool> per_vertex_visibility = compute_per_vertex_self_occlusion(
        mesh.vertices, mesh.tvi, view_model_matrix, ray_direction_type);

    vector<Vector4f> wnd_coords; // will contain [x_wnd, y_wnd, z_ndc, 1/w_clip]
    for (auto&& vtx : mesh.vertices)
    {
        Vector4f clip_coords = projection_matrix * view_model_matrix * vtx.homogeneous();
        clip_coords = divide_by_w(clip_coords);
        // Note: We could make use of a new `viewport` parameter here, to allow any viewport transformations.
        const Vector2f screen_coords =
            clip_to_screen_space(clip_coords.x(), clip_coords.y(), image.width(), image.height());
        clip_coords.x() = screen_coords.x(); // Todo: Can simplify this...?
        clip_coords.y() = screen_coords.y();
        wnd_coords.push_back(clip_coords);
    }

    // Go on with extracting: This only needs the rasteriser/FS, not the whole Renderer.
    const int tex_width = texturemap_resolution;
    const int tex_height =
        texturemap_resolution; // keeping this in case we need non-square texture maps at some point

    // Use Mesh::tti as texture triangle indices if present, tvi otherwise:
    const auto& mesh_tti = mesh.tti.empty() ? mesh.tvi : mesh.tti;

    for (std::size_t triangle_index = 0; triangle_index < mesh.tvi.size(); ++triangle_index)
    {
        // Select the three indices for the current triangle:
        const auto& tvi = mesh.tvi[triangle_index];
        const auto& tti = mesh_tti[triangle_index];

        // Check if all three vertices of the current triangle are visible, and use the triangle if so:
        if (per_vertex_visibility[tvi[0]] && per_vertex_visibility[tvi[1]] &&
            per_vertex_visibility[tvi[2]]) // can also try using ||, but...
        {
            // The model's texcoords become the locations to extract to in the framebuffer (which is the
            // texture map we're extracting to). The wnd_coords are the coordinates we're extracting from (the
            // original image), which from the perspective of the rasteriser, is the texture map, and thus
            // from the rasteriser's perspective they're the texture coords.
            //
            // (Note: A test with a rendered & re-extracted texture showed that we're off by a pixel or more,
            //  definitely need to correct this. Probably here. It looks like it is 1-2 pixels off. Definitely
            //  a bit more than 1.)
            detail::Vertex<double> pa{
                Vector4d(mesh.texcoords[tti[0]][0] * tex_width,
					 mesh.texcoords[tti[0]][1] * tex_height,
                     wnd_coords[tvi[0]].z(), // z_ndc
                     wnd_coords[tvi[0]].w()), // 1/w_clip
                Vector3d(),                       // empty
                Vector2d(wnd_coords[tvi[0]].x() / image.width(),
                     wnd_coords[tvi[0]].y() /
                         image.height() // (maybe '1 - wndcoords...'?) wndcoords of the projected/rendered
                                        // model triangle (in the input img). Normalised to 0,1.
					)};
            detail::Vertex<double> pb{
                Vector4d(mesh.texcoords[tti[1]][0] * tex_width,
				mesh.texcoords[tti[1]][1] * tex_height,
                     wnd_coords[tvi[1]].z(), // z_ndc
                     wnd_coords[tvi[1]].w()), // 1/w_clip
                Vector3d(),                       // empty
                Vector2d(wnd_coords[tvi[1]].x() / image.width(),
                     wnd_coords[tvi[1]].y() /
                         image.height() // (maybe '1 - wndcoords...'?) wndcoords of the projected/rendered
                                        // model triangle (in the input img). Normalised to 0,1.
					)};
            detail::Vertex<double> pc{
                Vector4d(mesh.texcoords[tti[2]][0] * tex_width,
				mesh.texcoords[tti[2]][1] * tex_height,
                     wnd_coords[tvi[2]].z(), // z_ndc
				wnd_coords[tvi[2]].w()), // 1/w_clip
                Vector3d(),                       // empty
                Vector2d(wnd_coords[tvi[2]].x() / image.width(),
                     wnd_coords[tvi[2]].y() /
                         image.height() // (maybe '1 - wndcoords...'?) wndcoords of the projected/rendered
                                        // model triangle (in the input img). Normalised to 0,1.
					)};
            // The wnd_coords (now p[a|b|c].texcoords) can actually be outside the image, if the head is
            // outside the image. Just skip the whole triangle if that is the case:
            if (pa.texcoords.x() < 0 || pa.texcoords.x() > 1 || pa.texcoords.y() < 0 || pa.texcoords.y() > 1 ||
                pb.texcoords.x() < 0 || pb.texcoords.x() > 1 || pb.texcoords.y() < 0 || pb.texcoords.y() > 1 ||
                pc.texcoords.x() < 0 || pc.texcoords.x() > 1 || pc.texcoords.y() < 0 || pc.texcoords.y() > 1)
            {
                continue;
            }
            extraction_rasterizer.raster_triangle(pa, pb, pc, image_to_extract_from_as_tex);
        }
    }

    return extraction_rasterizer.colorbuffer;
}